

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_if_zmqhub.c
# Opt level: O0

void * csp_zmqhub_task(void *param)

{
  uint uVar1;
  int iVar2;
  undefined4 uVar3;
  uint uVar4;
  undefined8 uVar5;
  csp_packet_t *pcVar6;
  void *__src;
  long in_RDI;
  uint8_t *rx_data;
  uint datalen;
  zmq_msg_t msg;
  int ret;
  uint32_t HEADER_SIZE;
  csp_packet_t *packet;
  zmq_driver_t *drv;
  csp_packet_t *in_stack_ffffffffffffff88;
  void *in_stack_ffffffffffffffa0;
  csp_iface_t *in_stack_ffffffffffffffa8;
  csp_packet_t *in_stack_ffffffffffffffb0;
  
  uVar1 = 4;
  if (csp_conf.version == '\x02') {
    uVar1 = 6;
  }
  do {
    while( true ) {
      while( true ) {
        zmq_msg_init_size(&stack0xffffffffffffffa0,uVar1 + 0x100);
        iVar2 = zmq_msg_recv(&stack0xffffffffffffffa0,*(undefined8 *)(in_RDI + 0x18),0);
        if (-1 < iVar2) break;
        in_stack_ffffffffffffff88 = *(csp_packet_t **)(in_RDI + 0x38);
        uVar3 = zmq_errno();
        uVar5 = zmq_strerror(uVar3);
        csp_print_func("ZMQ RX err %s: %s\n",in_stack_ffffffffffffff88,uVar5);
      }
      uVar4 = zmq_msg_size(&stack0xffffffffffffffa0);
      if (uVar1 <= uVar4) break;
      csp_print_func("ZMQ RX %s: Too short datalen: %u - expected min %u bytes\n",
                     *(undefined8 *)(in_RDI + 0x38),(ulong)uVar4,(ulong)uVar1);
      zmq_msg_close(&stack0xffffffffffffffa0);
    }
    pcVar6 = csp_buffer_get(0x1150c5);
    if (pcVar6 == (csp_packet_t *)0x0) {
      csp_print_func("RX %s: Failed to get csp_buffer(%u)\n",*(undefined8 *)(in_RDI + 0x38),
                     (ulong)uVar4);
      zmq_msg_close(&stack0xffffffffffffffa0);
    }
    else {
      __src = (void *)zmq_msg_data(&stack0xffffffffffffffa0);
      csp_id_setup_rx(in_stack_ffffffffffffff88);
      memcpy((pcVar6->field_0).field_1.frame_begin,__src,(ulong)uVar4);
      (pcVar6->field_0).field_1.frame_length = (uint16_t)uVar4;
      iVar2 = csp_id_strip(in_stack_ffffffffffffff88);
      if (iVar2 == 0) {
        csp_qfifo_write(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                        in_stack_ffffffffffffffa0);
        zmq_msg_close(&stack0xffffffffffffffa0);
      }
      else {
        *(int *)(in_RDI + 0x68) = *(int *)(in_RDI + 0x68) + 1;
        csp_buffer_free(__src);
        zmq_msg_close(&stack0xffffffffffffffa0);
      }
    }
  } while( true );
}

Assistant:

void * csp_zmqhub_task(void * param) {

	zmq_driver_t * drv = param;
	csp_packet_t * packet;
	const uint32_t HEADER_SIZE = (csp_conf.version == 2) ? 6 : 4;

	while (1) {
		int ret;
		(void)ret; /* Silence unused variable warning (promoted to an error if -Werr) issued when building with NDEBUG (release with asserts turned off) */
		zmq_msg_t msg;

		ret = zmq_msg_init_size(&msg, sizeof(packet->data) + HEADER_SIZE);
		assert(ret == 0);

		// Receive data
		if (zmq_msg_recv(&msg, drv->subscriber, 0) < 0) {
			csp_print("ZMQ RX err %s: %s\n", drv->iface.name, zmq_strerror(zmq_errno()));
			continue;
		}

		unsigned int datalen = zmq_msg_size(&msg);
		if (datalen < HEADER_SIZE) {
			csp_print("ZMQ RX %s: Too short datalen: %u - expected min %u bytes\n", drv->iface.name, datalen, HEADER_SIZE);
			zmq_msg_close(&msg);
			continue;
		}

		// Create new csp packet
		packet = csp_buffer_get(0);
		if (packet == NULL) {
			csp_print("RX %s: Failed to get csp_buffer(%u)\n", drv->iface.name, datalen);
			zmq_msg_close(&msg);
			continue;
		}

		// Copy the data from zmq to csp
		const uint8_t * rx_data = zmq_msg_data(&msg);

		csp_id_setup_rx(packet);

		memcpy(packet->frame_begin, rx_data, datalen);
		packet->frame_length = datalen;

		/* Parse the frame and strip the ID field */
		if (csp_id_strip(packet) != 0) {
			drv->iface.rx_error++;
			csp_buffer_free(packet);
		    zmq_msg_close(&msg);
			continue;
		}

		// Route packet
		csp_qfifo_write(packet, &drv->iface, NULL);

		zmq_msg_close(&msg);
	}

	return NULL;
}